

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosPluginManager.cpp
# Opt level: O1

OperatorCreateFun * __thiscall
adios2::plugin::PluginManager::GetOperatorCreateFun
          (OperatorCreateFun *__return_storage_ptr__,PluginManager *this,string *name)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>_>_>
  *this_00;
  Impl *pIVar1;
  size_t __c;
  __node_ptr p_Var2;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = (this->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::plugin::PluginManager::Impl,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::plugin::PluginManager::Impl_*,_std::default_delete<adios2::plugin::PluginManager::Impl>_>
           .super__Head_base<0UL,_adios2::plugin::PluginManager::Impl_*,_false>._M_head_impl;
  this_00 = &pIVar1->m_OperatorRegistry;
  __c = std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,name);
  p_Var2 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,
                          __c % *(size_type *)((long)&(pIVar1->m_OperatorRegistry)._M_h + 8),name,
                          __c);
  if (p_Var2 == (__node_ptr)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Plugins","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"PluginManager","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GetOperatorCreateFun","");
    std::operator+(&local_50,"Couldn\'t find operator plugin named ",name);
    helper::Throw<std::runtime_error>(&local_70,&local_90,&local_b0,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  std::
  function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::function(__return_storage_ptr__,
             (function<adios2::plugin::PluginOperatorInterface_*(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
              *)((long)&(p_Var2->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::plugin::(anonymous_namespace)::OperatorPluginInfo>_>
                        ._M_storage._M_storage + 0x48));
  return __return_storage_ptr__;
}

Assistant:

PluginManager::OperatorCreateFun PluginManager::GetOperatorCreateFun(const std::string &name)
{
    auto pluginIt = m_Impl->m_OperatorRegistry.find(name);
    if (pluginIt == m_Impl->m_OperatorRegistry.end())
    {
        helper::Throw<std::runtime_error>("Plugins", "PluginManager", "GetOperatorCreateFun",
                                          "Couldn't find operator plugin named " + name);
    }

    return pluginIt->second.m_HandleCreate;
}